

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactNodeXYZROT::ComputeJacobianForContactPart
          (ChContactNodeXYZROT *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  uint uVar1;
  ActualDstType actualDst;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  ChMatrix33<double> local_78;
  ChMatrix33<double> *local_30;
  
  local_30 = contact_plane;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_78,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_30);
  if (!second) {
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6].
         _4_4_ ^ 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_ =
         local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
         _4_4_ ^ 0x80000000;
    auVar4._0_8_ = -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8];
    auVar4._8_4_ = 0;
    auVar4._12_4_ = 0x80000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlps_avx(auVar4);
  }
  uVar1 = -((uint)((ulong)&jacobian_tuple_N->Cq >> 3) & 0x1fffffff) & 6;
  uVar2 = 3;
  if (uVar1 < 3) {
    uVar2 = uVar1;
  }
  if (uVar1 != 0) {
    memcpy(&jacobian_tuple_N->Cq,&local_78,(ulong)(uVar2 * 8));
  }
  if (uVar2 != 3) {
    uVar3 = (ulong)(uVar2 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar3),
           (void *)((long)local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar3),0x18 - uVar3);
  }
  uVar1 = -((uint)((ulong)&jacobian_tuple_U->Cq >> 3) & 0x1fffffff) & 6;
  uVar2 = 3;
  if (uVar1 < 3) {
    uVar2 = uVar1;
  }
  if (uVar1 != 0) {
    memcpy(&jacobian_tuple_U->Cq,
           (double *)
           ((long)local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x18),(ulong)(uVar2 * 8));
  }
  if (uVar2 != 3) {
    uVar3 = (ulong)(uVar2 << 3);
    memcpy((void *)((long)(jacobian_tuple_U->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar3),
           (void *)((long)local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar3 + 0x18),0x18 - uVar3);
  }
  uVar1 = -((uint)((ulong)&jacobian_tuple_V->Cq >> 3) & 0x1fffffff) & 6;
  uVar2 = 3;
  if (uVar1 < 3) {
    uVar2 = uVar1;
  }
  if (uVar1 != 0) {
    memcpy(&jacobian_tuple_V->Cq,
           (double *)
           ((long)local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x30),(ulong)(uVar2 * 8));
  }
  if (uVar2 != 3) {
    uVar3 = (ulong)(uVar2 << 3);
    memcpy((void *)((long)(jacobian_tuple_V->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar3),
           (void *)((long)local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar3 + 0x30),0x18 - uVar3);
  }
  return;
}

Assistant:

void ChContactNodeXYZROT::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                                        ChMatrix33<>& contact_plane,
                                                        type_constraint_tuple& jacobian_tuple_N,
                                                        type_constraint_tuple& jacobian_tuple_U,
                                                        type_constraint_tuple& jacobian_tuple_V,
                                                        bool second) {
    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);
}